

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::optional_idx>
          (Serializer *this,field_id_t field_id,char *tag,optional_idx *value)

{
  idx_t iVar1;
  byte bVar2;
  optional_idx local_20;
  
  bVar2 = value->index != 0xffffffffffffffff | (byte)this[9];
  if (bVar2 == 0) {
    (**(code **)(*(long *)this + 0x20))(this,field_id,tag,0);
  }
  else {
    (**(code **)(*(long *)this + 0x20))(this,field_id,tag,1);
    local_20 = (optional_idx)value->index;
    if (local_20.index == 0xffffffffffffffff) {
      iVar1 = 0xffffffffffffffff;
    }
    else {
      iVar1 = optional_idx::GetIndex(&local_20);
    }
    (**(code **)(*(long *)this + 0xa8))(this,iVar1);
  }
  (**(code **)(*(long *)this + 0x28))(this,bVar2);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && SerializationDefaultValue::IsDefault<T>(value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}